

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  CppType CVar1;
  long lVar2;
  Type TVar3;
  CppType CVar4;
  int32 iVar5;
  uint uVar6;
  int iVar7;
  LogMessage *pLVar8;
  size_t sVar9;
  string *psVar10;
  int64 iVar11;
  ulong uVar12;
  LogFinisher local_59;
  LogMessage local_58;
  
  TVar3 = FieldDescriptor::type(field);
  CVar1 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4);
  CVar4 = MapKey::type(value);
  if (CVar1 != CVar4) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4d5);
    pLVar8 = LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (FieldDescriptor::TypeToCppType(field->type())) == (value.type()): "
                       );
    LogFinisher::operator=(&local_59,pLVar8);
    LogMessage::~LogMessage(&local_58);
  }
  TVar3 = FieldDescriptor::type(field);
  switch(TVar3) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4dd);
    pLVar8 = LogMessage::operator<<(&local_58,"Unsupported");
    LogFinisher::operator=(&local_59,pLVar8);
    goto LAB_005ce6e1;
  case TYPE_INT64:
    uVar12 = MapKey::GetInt64Value(value);
    goto LAB_005ce782;
  case TYPE_UINT64:
    uVar12 = MapKey::GetUInt64Value(value);
    goto LAB_005ce782;
  case TYPE_INT32:
    uVar6 = MapKey::GetInt32Value(value);
    if ((int)uVar6 < 0) {
      return 10;
    }
    goto LAB_005ce767;
  case TYPE_FIXED64:
  case TYPE_SFIXED64:
    sVar9 = 8;
    break;
  case TYPE_FIXED32:
  case TYPE_SFIXED32:
    sVar9 = 4;
    break;
  case TYPE_BOOL:
    sVar9 = 1;
    break;
  case TYPE_STRING:
    psVar10 = MapKey::GetStringValue_abi_cxx11_(value);
    uVar6 = (uint)psVar10->_M_string_length | 1;
    iVar7 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    sVar9 = (ulong)(iVar7 * 9 + 0x49U >> 6) + psVar10->_M_string_length;
    break;
  case TYPE_UINT32:
    uVar6 = MapKey::GetUInt32Value(value);
LAB_005ce767:
    iVar7 = 0x1f;
    if ((uVar6 | 1) != 0) {
      for (; (uVar6 | 1) >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    goto LAB_005ce7e1;
  case TYPE_SINT32:
    iVar5 = MapKey::GetInt32Value(value);
    uVar6 = iVar5 >> 0x1f ^ iVar5 * 2 | 1;
    iVar7 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    goto LAB_005ce7e1;
  case MAX_TYPE:
    iVar11 = MapKey::GetInt64Value(value);
    uVar12 = iVar11 >> 0x3f ^ iVar11 * 2;
LAB_005ce782:
    lVar2 = 0x3f;
    if ((uVar12 | 1) != 0) {
      for (; (uVar12 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar7 = (int)lVar2;
LAB_005ce7e1:
    sVar9 = (size_t)(iVar7 * 9 + 0x49U >> 6);
    break;
  default:
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x4f8);
    pLVar8 = LogMessage::operator<<(&local_58,"Cannot get here");
    LogFinisher::operator=(&local_59,pLVar8);
LAB_005ce6e1:
    LogMessage::~LogMessage(&local_58);
    sVar9 = 0;
  }
  return sVar9;
}

Assistant:

static size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                                     const MapKey& value) {
  GOOGLE_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      GOOGLE_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  GOOGLE_LOG(FATAL) << "Cannot get here";
  return 0;
}